

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OtherVisitor.hpp
# Opt level: O3

void __thiscall OpenMD::PrepareVisitor::~PrepareVisitor(PrepareVisitor *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_BaseVisitor)._vptr_BaseVisitor = (_func_int **)&PTR__BaseVisitor_002b6050;
  pcVar2 = (this->super_BaseVisitor).visitorName._M_dataplus._M_p;
  paVar1 = &(this->super_BaseVisitor).visitorName.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x28);
  return;
}

Assistant:

PrepareVisitor() : BaseVisitor() { visitorName = "prepareVisitor"; }